

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetReader::AddVirtualColumn(ParquetReader *this,column_t virtual_column_id)

{
  pointer pPVar1;
  InternalException *this_00;
  allocator local_a9;
  ParquetColumnSchema local_a8;
  
  if (virtual_column_id == 0x8000000000000001) {
    pPVar1 = unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
             ::operator->(&this->root_schema);
    FileRowNumberSchema();
    ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    emplace_back<duckdb::ParquetColumnSchema>
              (&(pPVar1->children).
                super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               ,&local_a8);
    ParquetColumnSchema::~ParquetColumnSchema(&local_a8);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_a8,"Unsupported virtual column id %d for parquet reader",&local_a9);
  InternalException::InternalException<unsigned_long>(this_00,(string *)&local_a8,virtual_column_id)
  ;
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ParquetReader::AddVirtualColumn(column_t virtual_column_id) {
	if (virtual_column_id == MultiFileReader::COLUMN_IDENTIFIER_FILE_ROW_NUMBER) {
		root_schema->children.push_back(FileRowNumberSchema());
	} else {
		throw InternalException("Unsupported virtual column id %d for parquet reader", virtual_column_id);
	}
}